

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.c
# Opt level: O0

void priority_queue_free(priority_queue_t *queue,_func_void_void_ptr *free_ptr)

{
  ulong local_20;
  size_t i;
  _func_void_void_ptr *free_ptr_local;
  priority_queue_t *queue_local;
  
  for (local_20 = 0; local_20 < queue->alloc_size; local_20 = local_20 + 1) {
    if (queue->pointers[local_20] != (void *)0x0) {
      if (free_ptr == (_func_void_void_ptr *)0x0) {
        ckd_free(queue->pointers[local_20]);
      }
      else {
        (*free_ptr)(queue->pointers[local_20]);
      }
    }
  }
  ckd_free(queue->pointers);
  ckd_free(queue);
  return;
}

Assistant:

void priority_queue_free(priority_queue_t *queue, void (*free_ptr)(void *a))
{
    size_t i;

    for (i = 0; i < queue->alloc_size; i++) {
        if (queue->pointers[i] != NULL) {
            if (free_ptr == NULL) {
                ckd_free(queue->pointers[i]);
            } else {
                free_ptr(queue->pointers[i]);
            }
        }
    }
    ckd_free(queue->pointers);
    ckd_free(queue);
}